

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O0

success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
toml::ok<std::__cxx11::string>(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  value_type *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  this = in_RDI;
  std::__cxx11::string::string(in_RSI,in_stack_ffffffffffffffe8);
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::success
            ((success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(this);
  return (success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_RDI;
}

Assistant:

success<typename std::decay<T>::type> ok(T&& v)
{
    return success<typename std::decay<T>::type>(std::forward<T>(v));
}